

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Vec_Bit_t * Pla_GenRandom(int nVars,int nNums,int fNonZero)

{
  uint uVar1;
  int iVar2;
  Vec_Bit_t *p;
  byte bVar3;
  Vec_Bit_t *vBits;
  int Count;
  int Mint;
  int fNonZero_local;
  int nNums_local;
  int nVars_local;
  
  vBits._4_4_ = 0;
  bVar3 = (byte)nVars;
  p = Vec_BitStart(1 << (bVar3 & 0x1f));
  if ((nVars < 1) || (0x1e < nVars)) {
    __assert_fail("nVars > 0 && nVars <= 30",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                  ,0x9a,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
  }
  if ((0 < nNums) && (nNums < 1 << (bVar3 - 1 & 0x1f))) {
    while (vBits._4_4_ < nNums) {
      uVar1 = Gia_ManRandom(0);
      uVar1 = uVar1 & (1 << (bVar3 & 0x1f)) - 1U;
      if (((fNonZero == 0) || (uVar1 != 0)) && (iVar2 = Vec_BitEntry(p,uVar1), iVar2 == 0)) {
        Vec_BitWriteEntry(p,uVar1,1);
        vBits._4_4_ = vBits._4_4_ + 1;
      }
    }
    return p;
  }
  __assert_fail("nNums > 0 && nNums < (1 << (nVars - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                ,0x9b,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
}

Assistant:

Vec_Bit_t * Pla_GenRandom( int nVars, int nNums, int fNonZero )
{
    int Mint, Count = 0;
    Vec_Bit_t * vBits = Vec_BitStart( 1 << nVars );
    assert( nVars > 0 && nVars <= 30 );
    assert( nNums > 0 && nNums < (1 << (nVars - 1)) );
    while ( Count < nNums )
    {
        Mint = Gia_ManRandom(0) & ((1 << nVars) - 1);
        if ( fNonZero && Mint == 0 )
            continue;
        if ( Vec_BitEntry(vBits, Mint) )
            continue;
        Vec_BitWriteEntry( vBits, Mint, 1 );
        Count++;
    }
    return vBits;
}